

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O0

bool __thiscall helics::EndpointInfo::updateTimeUpTo(EndpointInfo *this,Time newTime)

{
  int iVar1;
  bool bVar2;
  pointer this_00;
  int *piVar3;
  long in_RDI;
  iterator it_final;
  iterator message;
  handle handle;
  int index;
  memory_order __b;
  memory_order __b_1;
  shared_guarded<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  *in_stack_ffffffffffffff08;
  _Deque_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_&,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*>
  *in_stack_ffffffffffffff10;
  _Self local_b0;
  _Self local_80;
  int local_44;
  TimeRepresentation<count_time<9,_long>_> local_38;
  byte local_2d;
  int local_2c;
  memory_order local_28;
  int local_24;
  int *local_20;
  int local_18;
  memory_order local_14;
  int local_10;
  int local_c;
  int *local_8;
  
  local_44 = 0;
  gmlc::libguarded::
  shared_guarded<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  ::lock(in_stack_ffffffffffffff08);
  gmlc::libguarded::
  lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  ::begin((lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
           *)in_stack_ffffffffffffff08);
  gmlc::libguarded::
  lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  ::end((lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
         *)in_stack_ffffffffffffff08);
  while (bVar2 = std::operator==(&local_80,&local_b0), ((bVar2 ^ 0xffU) & 1) != 0) {
    std::
    _Deque_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_&,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*>
    ::operator*(&local_80);
    this_00 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                        ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                         0x5dcca5);
    bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>=(&this_00->time,&local_38);
    if (bVar2) break;
    local_44 = local_44 + 1;
    std::
    _Deque_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_&,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*>
    ::operator++(in_stack_ffffffffffffff10);
  }
  iVar1 = local_44;
  piVar3 = (int *)(in_RDI + 0xd0);
  local_24 = 5;
  local_20 = piVar3;
  local_28 = std::operator&(seq_cst,__memory_order_mask);
  if (local_24 - 1U < 2) {
    local_2c = *piVar3;
  }
  else if (local_24 == 5) {
    local_2c = *piVar3;
  }
  else {
    local_2c = *piVar3;
  }
  if (iVar1 == local_2c) {
    local_2d = 0;
  }
  else {
    piVar3 = (int *)(in_RDI + 0xd0);
    local_c = local_44;
    local_10 = 5;
    local_8 = piVar3;
    local_14 = std::operator&(seq_cst,__memory_order_mask);
    local_18 = local_c;
    if (local_10 == 3) {
      *piVar3 = local_c;
    }
    else if (local_10 == 5) {
      LOCK();
      *piVar3 = local_c;
      UNLOCK();
    }
    else {
      *piVar3 = local_c;
    }
    local_2d = 1;
  }
  gmlc::libguarded::
  lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  ::~lock_handle((lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
                  *)0x5dce94);
  return (bool)(local_2d & 1);
}

Assistant:

bool EndpointInfo::updateTimeUpTo(Time newTime)
{
    int index{0};
    auto handle = message_queue.lock();

    auto message = handle.begin();
    auto it_final = handle.end();
    while (message != it_final) {
        if ((*message)->time >= newTime) {
            break;
        }
        ++index;
        ++message;
    }
    if (index != mAvailableMessages.load()) {
        mAvailableMessages.store(index);
        return true;
    }
    return false;
}